

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestHarness_cTest.cpp
# Opt level: O0

void __thiscall
TEST_TestHarness_c_checkUnsignedLongIntText_TestShell::
TEST_TestHarness_c_checkUnsignedLongIntText_TestShell
          (TEST_TestHarness_c_checkUnsignedLongIntText_TestShell *this)

{
  TEST_TestHarness_c_checkUnsignedLongIntText_TestShell *this_local;
  
  UtestShell::UtestShell(&this->super_UtestShell);
  (this->super_UtestShell)._vptr_UtestShell =
       (_func_int **)&PTR__TEST_TestHarness_c_checkUnsignedLongIntText_TestShell_004087d8;
  return;
}

Assistant:

TEST(TestHarness_c, checkUnsignedLongIntText)
{
    CHECK_EQUAL_C_ULONG_TEXT(2, 2, "Text");
    fixture->setTestFunction(failUnsignedLongIntTextMethod_);
    fixture->runAllTests();
    fixture->assertPrintContains("expected <1 (0x1)>\n\tbut was  <2 (0x2)>");
    fixture->assertPrintContains("arness_c");
    fixture->assertPrintContains("Message: UnsignedLongIntTestText");
    CHECK(!hasDestructorOfTheDestructorCheckedBeenCalled);
}